

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.hpp
# Opt level: O3

void __thiscall
Args::Command::Command<char_const(&)[4]>
          (Command *this,char (*nm) [4],ValueOptions opt,bool isSubCommandRequired)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  pointer pcVar3;
  bool bVar4;
  long lVar5;
  long *plVar6;
  logic_error *plVar7;
  char *pcVar8;
  ulong *puVar9;
  ulong *local_e0;
  undefined8 local_d0;
  undefined8 uStack_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  uint *local_a0;
  undefined8 local_98;
  uint local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  String *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  GroupIface::GroupIface<char_const(&)[4]>(&this->super_GroupIface,nm,false);
  (this->super_GroupIface).super_ArgIface._vptr_ArgIface = (_func_int **)&PTR__Command_00139cc8;
  *(ValueOptions *)&(this->super_GroupIface).field_0x4c = opt;
  local_58 = &this->m_valueSpecifier;
  local_60 = &(this->m_valueSpecifier).field_2;
  (this->m_valueSpecifier)._M_dataplus._M_p = (pointer)local_60;
  (this->m_valueSpecifier)._M_string_length = 0;
  (this->m_valueSpecifier).field_2._M_local_buf[0] = '\0';
  (this->m_description)._M_dataplus._M_p = (pointer)&(this->m_description).field_2;
  (this->m_description)._M_string_length = 0;
  (this->m_description).field_2._M_local_buf[0] = '\0';
  (this->m_longDescription)._M_dataplus._M_p = (pointer)&(this->m_longDescription).field_2;
  (this->m_longDescription)._M_string_length = 0;
  (this->m_longDescription).field_2._M_local_buf[0] = '\0';
  this->m_isDefined = false;
  this->m_isSubCommandRequired = isSubCommandRequired;
  (this->m_values).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_values).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_values).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_defaultValues).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_defaultValues).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_defaultValues).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_subCommand = (Command *)0x0;
  paVar1 = &local_c0.field_2;
  pcVar3 = (this->super_GroupIface).m_name._M_dataplus._M_p;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar3,pcVar3 + (this->super_GroupIface).m_name._M_string_length);
  lVar5 = std::__cxx11::string::find((char *)&local_c0,0x12b8d3,0);
  if (lVar5 == 0) {
    bVar4 = true;
  }
  else {
    (*(this->super_GroupIface).super_ArgIface._vptr_ArgIface[3])(&local_80,this);
    lVar5 = std::__cxx11::string::find((char *)&local_80,0x12b8d3,0);
    if ((lVar5 == 0) || (lVar5 = std::__cxx11::string::find((char)&local_80,0x2d), lVar5 != 0)) {
      bVar4 = false;
    }
    else {
      bVar4 = true;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (!bVar4) {
    (*(this->super_GroupIface).super_ArgIface._vptr_ArgIface[3])(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if (local_c0._M_string_length != 0) {
      iVar2 = *(int *)&(this->super_GroupIface).field_0x4c;
      if (iVar2 == 1) {
        pcVar8 = "arg";
      }
      else {
        if (iVar2 != 2) {
          return;
        }
        pcVar8 = "args";
      }
      std::__cxx11::string::_M_replace
                ((ulong)local_58,0,(char *)(this->m_valueSpecifier)._M_string_length,(ulong)pcVar8);
      return;
    }
    plVar7 = (logic_error *)__cxa_allocate_exception(0x30);
    local_a0 = &local_90;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"Command can\'t be with empty name.","");
    std::logic_error::logic_error(plVar7,"Please use desc() method of the exception.");
    *(undefined ***)plVar7 = &PTR__BaseException_00139a88;
    *(logic_error **)(plVar7 + 0x10) = plVar7 + 0x20;
    if (local_a0 == &local_90) {
      *(uint *)(plVar7 + 0x20) = local_90;
      *(undefined4 *)(plVar7 + 0x24) = uStack_8c;
      *(undefined4 *)(plVar7 + 0x28) = uStack_88;
      *(undefined4 *)(plVar7 + 0x2c) = uStack_84;
    }
    else {
      *(uint **)(plVar7 + 0x10) = local_a0;
      *(ulong *)(plVar7 + 0x20) = CONCAT44(uStack_8c,local_90);
    }
    *(undefined8 *)(plVar7 + 0x18) = local_98;
    local_a0 = &local_90;
    local_98 = 0;
    local_90 = local_90 & 0xffffff00;
    __cxa_throw(plVar7,&BaseException::typeinfo,BaseException::~BaseException);
  }
  plVar7 = (logic_error *)__cxa_allocate_exception(0x30);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,
             "Command\'s name can\'t start with \"-\" whereas you are trying to set name to \"","");
  (*(this->super_GroupIface).super_ArgIface._vptr_ArgIface[3])(&local_50,this);
  std::operator+(&local_c0,&local_80,&local_50);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_c0);
  local_e0 = (ulong *)*plVar6;
  puVar9 = (ulong *)(plVar6 + 2);
  if (local_e0 == puVar9) {
    local_d0 = *puVar9;
    uStack_c8 = plVar6[3];
    local_e0 = &local_d0;
  }
  else {
    local_d0 = *puVar9;
  }
  lVar5 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::logic_error::logic_error(plVar7,"Please use desc() method of the exception.");
  *(undefined ***)plVar7 = &PTR__BaseException_00139a88;
  *(logic_error **)(plVar7 + 0x10) = plVar7 + 0x20;
  if (local_e0 == &local_d0) {
    *(undefined4 *)(plVar7 + 0x20) = (undefined4)local_d0;
    *(undefined4 *)(plVar7 + 0x24) = local_d0._4_4_;
    *(undefined4 *)(plVar7 + 0x28) = (undefined4)uStack_c8;
    *(undefined4 *)(plVar7 + 0x2c) = uStack_c8._4_4_;
  }
  else {
    *(ulong **)(plVar7 + 0x10) = local_e0;
    *(ulong *)(plVar7 + 0x20) = local_d0;
  }
  *(long *)(plVar7 + 0x18) = lVar5;
  local_d0 = local_d0 & 0xffffffffffffff00;
  __cxa_throw(plVar7,&BaseException::typeinfo,BaseException::~BaseException);
}

Assistant:

explicit Command( T && nm,
		ValueOptions opt = ValueOptions::NoValue,
		bool isSubCommandRequired = false )
		:	GroupIface( std::forward< T > ( nm ) )
		,	m_opt( opt )
		,	m_isDefined( false )
		,	m_isSubCommandRequired( isSubCommandRequired )
		,	m_subCommand( nullptr )
	{
		if( details::isArgument( name() ) || details::isFlag( name() ) )
			throw BaseException( String( SL( "Command's name can't "
				"start with \"-\" whereas you are trying to set name to \"" ) ) +
				name() + SL( "\"." ) );

		if( name().empty() )
			throw BaseException(
				String( SL( "Command can't be with empty name." ) ) );

		switch( m_opt )
		{
			case ValueOptions::OneValue :
			{
				m_valueSpecifier = SL( "arg" );
			}
				break;

			case ValueOptions::ManyValues :
			{
				m_valueSpecifier = SL( "args" );
			}
				break;

			default :
				break;
		}
	}